

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_and(Parser *parser)

{
  Token *op;
  void *right;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  tok = (Token *)parse_equals(parser);
  while (parser->token->kind == AND) {
    op = parser->token;
    move(parser);
    right = parse_equals(parser);
    tok = (Token *)new_binary_expr(tok,op,right);
  }
  return tok;
}

Assistant:

void *parse_and(Parser *parser) {
    void *left = parse_equals(parser);
    Token *tok = token(parser);
    while (token(parser)->kind == AND) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_equals(parser));

    }
    return left;
}